

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O2

uint32_t __thiscall ArchiveMemberHeader::getSize(ArchiveMemberHeader *this)

{
  void *pvVar1;
  ulong uVar2;
  Fatal local_1c0;
  undefined1 local_38 [8];
  string sizeString;
  
  pvVar1 = memchr(this->size,0x20,10);
  local_38 = (undefined1  [8])&sizeString._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,this->size,pvVar1);
  uVar2 = std::__cxx11::stoll((string *)local_38,(size_t *)0x0,10);
  if (uVar2 < 0xffffffff) {
    std::__cxx11::string::~string((string *)local_38);
    return (uint32_t)uVar2;
  }
  ::wasm::Fatal::Fatal(&local_1c0);
  ::wasm::Fatal::operator<<(&local_1c0,(char (*) [40])"Malformed archive: size parsing failed\n");
  ::wasm::Fatal::~Fatal(&local_1c0);
}

Assistant:

uint32_t ArchiveMemberHeader::getSize() const {
  auto* end = static_cast<const char*>(memchr(size, ' ', sizeof(size)));
  std::string sizeString((const char*)size, end);
  auto sizeInt = std::stoll(sizeString, nullptr, 10);
  if (sizeInt < 0 || sizeInt >= std::numeric_limits<uint32_t>::max()) {
    wasm::Fatal() << "Malformed archive: size parsing failed\n";
  }
  return static_cast<uint32_t>(sizeInt);
}